

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

void lj_debug_pushloc(lua_State *L,GCproto *pt,BCPos pc)

{
  char cVar1;
  uint uVar2;
  uint64_t uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  GCproto *pGVar7;
  
  uVar3 = (pt->chunkname).gcptr64;
  pGVar7 = (GCproto *)(uVar3 + 0x18);
  uVar2 = *(uint *)(uVar3 + 0x14);
  uVar4 = lj_debug_line(pt,pc);
  if (pt->firstline == -1) {
    lj_strfmt_pushf(L,"builtin:%s",pGVar7);
    return;
  }
  cVar1 = (char)(pGVar7->nextgc).gcptr64;
  if (cVar1 == '@') {
    uVar5 = uVar2 + 1;
    pcVar6 = (char *)(uVar3 + (uVar2 - 1) + 0x19);
    pGVar7 = (GCproto *)(uVar3 + 0x19);
    do {
      if (uVar5 == 2) goto LAB_00114962;
      cVar1 = *pcVar6;
      uVar5 = uVar5 - 1;
    } while ((cVar1 != '\\') && (pcVar6 = pcVar6 + -1, cVar1 != '/'));
    pGVar7 = (GCproto *)((long)&(pGVar7->nextgc).gcptr64 + (ulong)uVar5);
  }
  else {
    if (0x28 < uVar2) {
      pcVar6 = "%p:%d";
      pGVar7 = pt;
      goto LAB_0011496f;
    }
    if (cVar1 != '=') {
      pcVar6 = "\"%s\":%d";
      goto LAB_0011496f;
    }
    pGVar7 = (GCproto *)(uVar3 + 0x19);
  }
LAB_00114962:
  pcVar6 = "%s:%d";
LAB_0011496f:
  lj_strfmt_pushf(L,pcVar6,pGVar7,(ulong)uVar4);
  return;
}

Assistant:

void lj_debug_pushloc(lua_State *L, GCproto *pt, BCPos pc)
{
  GCstr *name = proto_chunkname(pt);
  const char *s = strdata(name);
  MSize i, len = name->len;
  BCLine line = lj_debug_line(pt, pc);
  if (pt->firstline == ~(BCLine)0) {
    lj_strfmt_pushf(L, "builtin:%s", s);
  } else if (*s == '@') {
    s++; len--;
    for (i = len; i > 0; i--)
      if (s[i] == '/' || s[i] == '\\') {
	s += i+1;
	break;
      }
    lj_strfmt_pushf(L, "%s:%d", s, line);
  } else if (len > 40) {
    lj_strfmt_pushf(L, "%p:%d", pt, line);
  } else if (*s == '=') {
    lj_strfmt_pushf(L, "%s:%d", s+1, line);
  } else {
    lj_strfmt_pushf(L, "\"%s\":%d", s, line);
  }
}